

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

int Abc_FileSize(char *pFileName)

{
  FILE *__stream;
  long lVar1;
  int nFileSize;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    pFileName_local._4_4_ = -1;
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    pFileName_local._4_4_ = (int)lVar1;
    fclose(__stream);
  }
  return pFileName_local._4_4_;
}

Assistant:

int Abc_FileSize( char * pFileName )
{
    FILE * pFile;
    int nFileSize;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return -1;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    fclose( pFile );
    return nFileSize;
}